

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O3

void __thiscall
my_crc_basic::my_crc_basic
          (my_crc_basic *this,uint width,value_type truncated_polynominal,
          value_type initial_remainder,value_type final_xor_value,bool reflect_input,
          bool reflect_remainder)

{
  this->width_ = width;
  this->rem_ = initial_remainder;
  this->poly_ = truncated_polynominal;
  this->init_ = initial_remainder;
  this->final_ = final_xor_value;
  this->rft_in_ = reflect_input;
  this->rft_out_ = reflect_remainder;
  this->high_bit_mask = (uint32_t)(1L << ((byte)width - 1 & 0x3f));
  this->sig_bits = ~(uint)(-1L << ((byte)width & 0x3f));
  return;
}

Assistant:

my_crc_basic::my_crc_basic( unsigned int width,
			    my_crc_basic::value_type  truncated_polynominal,
			    my_crc_basic::value_type  initial_remainder,      // = 0
			    my_crc_basic::value_type  final_xor_value,        // = 0
			    bool                                  reflect_input,          // = false
			    bool                                  reflect_remainder       // = false
			    )
  : width_(width), rem_( initial_remainder ), poly_( truncated_polynominal )
  , init_( initial_remainder ), final_( final_xor_value )
  , rft_in_( reflect_input ), rft_out_( reflect_remainder )
{
  high_bit_mask = 1ul << ( width - 1u );
  sig_bits = (~( ~( 0ul ) << width )) ;
  
}